

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldMetadata
          (MessageGenerator *this,Printer *printer)

{
  Formatter *pFVar1;
  _Rb_tree_color _Var2;
  byte bVar3;
  uint uVar4;
  Formatter *pFVar5;
  _Base_ptr p_Var6;
  ExtensionRange *pEVar7;
  MessageGenerator *pMVar8;
  undefined8 uVar9;
  bool bVar10;
  uint32_t uVar11;
  int iVar12;
  FileOptions_OptimizeMode FVar13;
  mapped_type *pmVar14;
  char *pcVar15;
  Descriptor *pDVar16;
  LogMessage *other;
  long *plVar17;
  ulong uVar18;
  undefined8 *puVar19;
  FieldGenerator *generator;
  _Base_ptr p_Var20;
  _Rb_tree_header *p_Var21;
  long *plVar22;
  ulong *puVar23;
  long lVar24;
  undefined1 *options;
  ExtensionRange *pEVar25;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  undefined8 uVar26;
  _Base_ptr p_Var27;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  ulong uVar28;
  long lVar29;
  uint32_t tag;
  string serializer;
  int type;
  SaveState saver;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Formatter format;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  sorted;
  _Alloc_hider local_238;
  size_type local_230;
  char local_228 [8];
  undefined8 in_stack_fffffffffffffde0;
  key_type local_218;
  uint local_1f4;
  Options *local_1f0;
  MessageGenerator *local_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0 [2];
  undefined1 local_1c0 [56];
  undefined8 local_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  undefined1 local_160 [16];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  FieldGeneratorMap *local_100;
  FieldGenerator *local_f8;
  string local_f0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  _Base_ptr local_a8;
  Formatter local_a0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_68;
  string local_50;
  
  local_100 = (FieldGeneratorMap *)&this->variables_;
  local_a0.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a0.vars_._M_t,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_100);
  iVar12 = 0;
  if ((this->options_).table_driven_serialization != true) goto LAB_002a7573;
  anon_unknown_0::SortFieldsByNumber(&local_68,this->descriptor_);
  local_1f0 = &this->options_;
  local_1e8 = this;
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\x01') {
    Formatter::operator()<>
              (&local_a0,"{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_), 0, 0, 0, nullptr},\n")
    ;
    local_128._0_8_ = (_Base_ptr)0x0;
    local_128._8_8_ = (_Base_ptr)0x0;
    local_128._16_8_ = (ExtensionRange **)0x0;
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::reserve((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               *)local_128,(long)*(int *)(this->descriptor_ + 0x78));
    pDVar16 = this->descriptor_;
    if (0 < *(int *)(pDVar16 + 0x78)) {
      lVar29 = 0;
      lVar24 = 0;
      do {
        local_1c0._0_8_ = *(long *)(pDVar16 + 0x48) + lVar29;
        if (local_128._8_8_ == local_128._16_8_) {
          std::
          vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor::ExtensionRange_const*>
                    ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                      *)local_128,(iterator)local_128._8_8_,(ExtensionRange **)local_1c0);
        }
        else {
          *(undefined8 *)local_128._8_8_ = local_1c0._0_8_;
          local_128._8_8_ = local_128._8_8_ + 8;
        }
        lVar24 = lVar24 + 1;
        pDVar16 = local_1e8->descriptor_;
        lVar29 = lVar29 + 0x10;
      } while (lVar24 < *(int *)(pDVar16 + 0x78));
    }
    uVar9 = local_128._8_8_;
    uVar26 = local_128._0_8_;
    pMVar8 = local_1e8;
    if (local_128._0_8_ != local_128._8_8_) {
      lVar29 = local_128._8_8_ - local_128._0_8_;
      uVar18 = lVar29 >> 3;
      lVar24 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar24 == 0; lVar24 = lVar24 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                (local_128._0_8_,local_128._8_8_,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar29 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (uVar26,uVar9);
      }
      else {
        p_Var20 = (_Base_ptr)(uVar26 + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (uVar26,p_Var20);
        for (; p_Var20 != (_Base_ptr)uVar9; p_Var20 = (_Base_ptr)&p_Var20->_M_parent) {
          p_Var6 = p_Var20[-1]._M_right;
          pEVar7 = *(ExtensionRange **)p_Var20;
          iVar12 = pEVar7->start;
          _Var2 = p_Var6->_M_color;
          p_Var27 = p_Var20;
          while (iVar12 < (int)_Var2) {
            *(_Base_ptr *)p_Var27 = p_Var6;
            p_Var6 = p_Var27[-1]._M_left;
            p_Var27 = (_Base_ptr)&p_Var27[-1]._M_right;
            _Var2 = p_Var6->_M_color;
          }
          *(ExtensionRange **)p_Var27 = pEVar7;
        }
      }
    }
    local_f8 = (FieldGenerator *)&pMVar8->field_generators_;
    lVar24 = 0;
    local_188 = (ulong)local_188._4_4_ << 0x20;
    do {
      uVar18 = (ulong)(int)local_188;
      uVar28 = (long)(local_128._8_8_ - local_128._0_8_) >> 3;
      if (uVar18 < uVar28) {
        do {
          if (((long)local_68.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3 != lVar24) &&
             (*(int *)(local_68.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar24] + 4) <=
              **(int **)(local_128._0_8_ + uVar18 * 8))) break;
          Formatter::operator()
                    (&local_a0,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::ExtensionSerializer)},\n"
                     ,*(int **)(local_128._0_8_ + uVar18 * 8),
                     *(int **)(local_128._0_8_ + uVar18 * 8) + 1);
          uVar18 = uVar18 + 1;
          uVar28 = (long)(local_128._8_8_ - local_128._0_8_) >> 3;
        } while (uVar18 < uVar28);
        local_188 = CONCAT44(local_188._4_4_,(int)uVar18);
      }
      lVar29 = (long)local_68.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (lVar29 == lVar24) goto LAB_002a74c1;
      pFVar5 = (Formatter *)
               local_68.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar24];
      iVar12 = *(int *)((long)&pFVar5->printer_ + 4);
      p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var20 != (_Base_ptr)0x0) {
        local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_160._0_8_ = pFVar5;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  ((once_flag *)p_Var20,(_func_void_FieldDescriptor_ptr **)local_1c0,
                   (FieldDescriptor **)local_160);
      }
      local_1f4 = iVar12 << 3 |
                  *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                           (ulong)*(byte *)((long)&pFVar5->printer_ + 2) * 4);
      bVar10 = FieldDescriptor::is_packed((FieldDescriptor *)pFVar5);
      if (bVar10) {
        local_1f4 = *(int *)((long)&pFVar5->printer_ + 4) * 8 + 2;
      }
      FieldName_abi_cxx11_((string *)local_160,(cpp *)pFVar5,field_00);
      pEVar7 = (ExtensionRange *)(local_1c0 + 0x10);
      p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      if ((p_Var20 != (_Base_ptr)0x0 && ((ulong)pFVar5->printer_ & 0x1000) != 0) &&
         ((*(int *)&p_Var20->field_0x4 != 1 ||
          (((*(byte *)(*(long *)(p_Var20 + 1) + 1) & 2) == 0 && (p_Var20 != (_Base_ptr)0x0)))))) {
        std::__cxx11::string::_M_assign((string *)local_160);
      }
      local_1c0._0_8_ = pEVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"field_name","");
      Formatter::Set<std::__cxx11::string>
                (&local_a0,(string *)local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
      if ((ExtensionRange *)local_1c0._0_8_ != pEVar7) {
        operator_delete((void *)local_1c0._0_8_);
      }
      local_d0._0_8_ = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"nullptr","");
      p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var20 != (_Base_ptr)0x0) {
        local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_238._M_p = (pointer)pFVar5;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  ((once_flag *)p_Var20,(_func_void_FieldDescriptor_ptr **)local_1c0,
                   (FieldDescriptor **)&local_238);
      }
      options = FieldDescriptor::kTypeToCppTypeMap;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                  (ulong)*(byte *)((long)&pFVar5->printer_ + 2) * 4) == 10) {
        pDVar16 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
        if (*(char *)(*(long *)(pDVar16 + 0x20) + 0x4b) != '\x01') {
          pDVar16 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
          if (*(char *)(*(long *)(pDVar16 + 0x20) + 0x48) != '\0') goto LAB_002a70f4;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"TableStruct","");
          pDVar16 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
          UniqueName(&local_50,&local_f0,(string *)**(undefined8 **)(pDVar16 + 0x10),local_1f0);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x419f58);
          local_180 = &local_170;
          plVar17 = puVar19 + 2;
          if ((long *)*puVar19 == plVar17) {
            local_170 = *plVar17;
            lStack_168 = puVar19[3];
          }
          else {
            local_170 = *plVar17;
            local_180 = (long *)*puVar19;
          }
          local_178 = puVar19[1];
          *puVar19 = plVar17;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          puVar23 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_218.field_2._M_allocated_capacity = *puVar23;
            local_218.field_2._8_8_ = puVar19[3];
          }
          else {
            local_218.field_2._M_allocated_capacity = *puVar23;
            local_218._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_218._M_string_length = puVar19[1];
          *puVar19 = puVar23;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
          iVar12 = anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffffde0);
          local_1c0._0_8_ = pEVar7;
          local_1c0._8_8_ = FastInt32ToBufferLeft(iVar12,(char *)pEVar7);
          local_1c0._8_8_ = local_1c0._8_8_ + -(long)pEVar7;
          local_1e0 = local_1d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e0,local_1c0._0_8_,
                     (char *)(local_1c0._8_8_ + local_1c0._0_8_));
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            uVar26 = local_218.field_2._M_allocated_capacity;
          }
          uVar18 = (long)(_Rb_tree_color *)local_218._M_string_length + local_1d8;
          if ((ulong)uVar26 < uVar18) {
            uVar28 = 0xf;
            if (local_1e0 != local_1d0) {
              uVar28 = local_1d0[0];
            }
            if (uVar28 < uVar18) goto LAB_002a6ff6;
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1e0,0,(char *)0x0,
                                         (ulong)local_218._M_dataplus._M_p);
          }
          else {
LAB_002a6ff6:
            plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1e0);
          }
          local_238._M_p = local_228;
          pFVar1 = (Formatter *)(plVar17 + 2);
          if ((Formatter *)*plVar17 == pFVar1) {
            local_228 = (char  [8])pFVar1->printer_;
            in_stack_fffffffffffffde0 = plVar17[3];
          }
          else {
            local_228 = (char  [8])pFVar1->printer_;
            local_238._M_p = (pointer)*plVar17;
          }
          local_230 = plVar17[1];
          *plVar17 = (long)pFVar1;
          plVar17[1] = 0;
          *(undefined1 *)&pFVar1->printer_ = 0;
          std::__cxx11::string::operator=((string *)local_d0,(string *)&local_238);
          if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
            operator_delete(local_238._M_p);
          }
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          goto LAB_002a70f4;
        }
        FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
        iVar12 = anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffffde0);
        local_238._M_p._0_4_ = iVar12;
        pDVar16 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
        QualifiedClassName_abi_cxx11_
                  ((string *)local_1c0,(cpp *)pDVar16,(Descriptor *)local_1f0,(Options *)options);
        Formatter::operator()
                  (&local_a0,
                   "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(static_cast< ::$proto_ns$::internal::SpecialSerializer>(::$proto_ns$::internal::MapFieldSerializer< ::$proto_ns$::internal::MapEntryToMapField<$3$>::MapFieldType, $tablename$::serialization_table>))},\n"
                   ,&local_1f4,(int *)&local_238,(string *)local_1c0);
        if ((ExtensionRange *)local_1c0._0_8_ != pEVar7) {
          operator_delete((void *)local_1c0._0_8_);
        }
      }
      else {
LAB_002a70f4:
        generator = FieldGeneratorMap::get((FieldGeneratorMap *)local_f8,(FieldDescriptor *)pFVar5);
        uVar11 = anon_unknown_0::CalcFieldNum(generator,(FieldDescriptor *)pFVar5,local_1f0);
        local_180 = (long *)CONCAT44(local_180._4_4_,uVar11);
        bVar10 = IsLazy((FieldDescriptor *)pFVar5,local_1f0,local_1e8->scc_analyzer_);
        if (bVar10) {
          local_180 = (long *)CONCAT44(local_180._4_4_,0x69);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"proto_ns","");
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_100,&local_218);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_238,"reinterpret_cast<const void*>(::",pmVar14);
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
          pEVar25 = (ExtensionRange *)(puVar19 + 2);
          if ((ExtensionRange *)*puVar19 == pEVar25) {
            local_1c0._16_4_ = pEVar25->start;
            local_1c0._20_4_ = pEVar25->end;
            local_1c0._24_8_ = puVar19[3];
            local_1c0._0_8_ = pEVar7;
          }
          else {
            local_1c0._16_4_ = pEVar25->start;
            local_1c0._20_4_ = pEVar25->end;
            local_1c0._0_8_ = (ExtensionRange *)*puVar19;
          }
          local_1c0._8_8_ = puVar19[1];
          *puVar19 = pEVar25;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_d0,(string *)local_1c0);
          if ((ExtensionRange *)local_1c0._0_8_ != pEVar7) {
            operator_delete((void *)local_1c0._0_8_);
          }
          if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
            operator_delete(local_238._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p);
          }
          bVar3 = *(byte *)((long)&pFVar5->printer_ + 1);
          bVar10 = (bVar3 & 0x10) == 0;
          p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          if ((p_Var20 != (_Base_ptr)0x0 && !bVar10) &&
             ((*(int *)&p_Var20->field_0x4 != 1 ||
              (((*(byte *)(*(long *)(p_Var20 + 1) + 1) & 2) == 0 && (p_Var20 != (_Base_ptr)0x0))))))
          goto LAB_002a72ac;
          if ((bVar3 & 2) == 0) {
            if (((bVar3 & 0x60) == 0x20) &&
               (*(char *)(*(long *)&(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header +
                         0x3a) == '\x02')) {
              if (p_Var20 == (_Base_ptr)0x0 || bVar10) goto LAB_002a729b;
            }
            else if ((bVar3 & 0x60) == 0x40) goto LAB_002a729b;
LAB_002a72ac:
            std::__cxx11::string::append(local_d0);
          }
          else {
LAB_002a729b:
            if ((pFVar5[1].printer_)->field_0x4f == '\x01') goto LAB_002a72ac;
          }
          std::__cxx11::string::append(local_d0);
        }
        if ((pFVar5[1].printer_)->field_0x4f == '\x01') {
          Formatter::operator()
                    (&local_a0,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _weak_field_map_), $1$, $1$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n"
                     ,&local_1f4);
        }
        else {
          bVar3 = *(byte *)((long)&pFVar5->printer_ + 1);
          bVar10 = (bVar3 & 0x10) == 0;
          p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          if ((p_Var20 != (_Base_ptr)0x0 && !bVar10) &&
             ((*(int *)&p_Var20->field_0x4 != 1 ||
              (((*(byte *)(*(long *)(p_Var20 + 1) + 1) & 2) == 0 && (p_Var20 != (_Base_ptr)0x0))))))
          {
            local_1c0._0_8_ = pEVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"oneofoffset","");
            if (((ulong)pFVar5->printer_ & 0x1000) == 0) {
              p_Var20 = (_Base_ptr)0x0;
            }
            else {
              p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            }
            local_238._M_p =
                 (pointer)((long)((int)((ulong)((long)p_Var20 - (long)p_Var20->_M_left[1]._M_left)
                                       >> 3) * -0x33333333) << 2);
            Formatter::Set<unsigned_long>(&local_a0,(string *)local_1c0,(unsigned_long *)&local_238)
            ;
            if ((ExtensionRange *)local_1c0._0_8_ != pEVar7) {
              operator_delete((void *)local_1c0._0_8_);
            }
            pcVar15 = 
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + $oneofoffset$, $2$, $3$},\n"
            ;
            goto LAB_002a7468;
          }
          if ((bVar3 & 2) == 0) {
            if (((bVar3 & 0x60) == 0x20) &&
               (*(char *)(*(long *)&(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header +
                         0x3a) == '\x02')) {
              pcVar15 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
              ;
              if (p_Var20 == (_Base_ptr)0x0 || bVar10) goto LAB_002a73d4;
            }
            else {
              pcVar15 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
              ;
              if ((bVar3 & 0x60) == 0x40) goto LAB_002a73d4;
            }
          }
          else {
LAB_002a73d4:
            local_1c0._0_8_ = pEVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"hasbitsoffset","");
            if (((ulong)pFVar5->printer_ & 0x800) == 0) {
              p_Var21 = (_Rb_tree_header *)
                        &(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              uVar18 = 0x28;
            }
            else {
              bVar10 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
                       (_Base_ptr)0x0;
              p_Var21 = (_Rb_tree_header *)
                        &(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              if (bVar10) {
                p_Var21 = &(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header;
              }
              uVar18 = (ulong)bVar10 << 5 | 0x50;
            }
            Formatter::Set<int>(&local_a0,(string *)local_1c0,
                                (local_1e8->has_bit_indices_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start +
                                (int)((ulong)((long)pFVar5 -
                                             *(long *)((long)&(*(_Base_ptr *)&p_Var21->_M_header)->
                                                              _M_color + uVar18)) >> 3) * 0x38e38e39
                               );
            if ((ExtensionRange *)local_1c0._0_8_ != pEVar7) {
              operator_delete((void *)local_1c0._0_8_);
            }
            pcVar15 = 
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + $hasbitsoffset$, $2$, $3$},\n"
            ;
          }
LAB_002a7468:
          Formatter::operator()
                    (&local_a0,pcVar15,&local_1f4,(int *)&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
        }
      }
      if ((Formatter *)local_d0._0_8_ != (Formatter *)local_c0) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((Formatter *)local_160._0_8_ != (Formatter *)local_150) {
        operator_delete((void *)local_160._0_8_);
      }
      lVar24 = lVar24 + 1;
    } while( true );
  }
  local_100 = &this->field_generators_;
  lVar24 = 0;
  do {
    pFVar5 = (Formatter *)
             local_68.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar24];
    local_188 = lVar24;
    local_f8 = FieldGeneratorMap::get(local_100,(FieldDescriptor *)pFVar5);
    iVar12 = *(int *)((long)&pFVar5->printer_ + 4);
    p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var20 != (_Base_ptr)0x0) {
      local_160._0_8_ = FieldDescriptor::TypeOnceInit;
      local_d0._0_8_ = pFVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                ((once_flag *)p_Var20,(_func_void_FieldDescriptor_ptr **)local_160,
                 (FieldDescriptor **)local_d0);
    }
    uVar4 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)*(byte *)((long)&pFVar5->printer_ + 2) * 4);
    local_d0._8_4_ = _S_red;
    local_c0._0_8_ = (Printer *)0x0;
    local_c0._8_8_ = local_d0 + 8;
    local_a8 = (_Base_ptr)0x0;
    local_c0._16_8_ = local_c0._8_8_;
    QualifiedClassName_abi_cxx11_
              ((string *)local_160,(cpp *)local_1e8->descriptor_,(Descriptor *)local_1f0,
               (Options *)0x0);
    local_238._M_p = local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"classtype","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d0,(key_type *)&local_238);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_160);
    field = extraout_RDX;
    if (local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
      field = extraout_RDX_00;
    }
    if ((Formatter *)local_160._0_8_ != (Formatter *)local_150) {
      operator_delete((void *)local_160._0_8_);
      field = extraout_RDX_01;
    }
    FieldName_abi_cxx11_((string *)local_160,(cpp *)pFVar5,field);
    local_238._M_p = local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"field_name","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d0,(key_type *)&local_238);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_160);
    if (local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
    }
    if ((Formatter *)local_160._0_8_ != (Formatter *)local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    local_160._0_8_ = (Formatter *)local_150;
    pcVar15 = FastUInt32ToBufferLeft(iVar12 << 3 | uVar4,(char *)local_150);
    local_160._8_8_ = (long)pcVar15 - (long)local_150;
    local_238._M_p = local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,local_160._0_8_,(char *)(local_160._0_8_ + local_160._8_8_));
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"tag","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d0,&local_218);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
    }
    local_160._0_8_ = (Formatter *)local_150;
    pcVar15 = FastInt32ToBufferLeft((int32)local_188,(char *)local_150);
    local_160._8_8_ = (long)pcVar15 - (long)local_150;
    local_238._M_p = local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,local_160._0_8_,(char *)(local_160._0_8_ + local_160._8_8_));
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"hasbit","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d0,&local_218);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
    }
    uVar11 = anon_unknown_0::CalcFieldNum(local_f8,(FieldDescriptor *)pFVar5,local_1f0);
    local_160._0_8_ = (Formatter *)local_150;
    pcVar15 = FastUInt32ToBufferLeft(uVar11,(char *)local_150);
    local_160._8_8_ = (long)pcVar15 - (long)local_150;
    local_238._M_p = local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,local_160._0_8_,(char *)(local_160._0_8_ + local_160._8_8_));
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"type","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d0,&local_218);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
      operator_delete(local_238._M_p);
    }
    local_160._0_8_ = (Formatter *)local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"ptr","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d0,(string *)local_160);
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x4165bf);
    if ((Formatter *)local_160._0_8_ != (Formatter *)local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    p_Var20 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var20 != (_Base_ptr)0x0) {
      local_160._0_8_ = FieldDescriptor::TypeOnceInit;
      local_238._M_p = (pointer)pFVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                ((once_flag *)p_Var20,(_func_void_FieldDescriptor_ptr **)local_160,
                 (FieldDescriptor **)&local_238);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                (ulong)*(byte *)((long)&pFVar5->printer_ + 2) * 4) == 10) {
      pDVar16 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
      if (*(char *)(*(long *)(pDVar16 + 0x20) + 0x4b) == '\x01') {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_1c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x870);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_1c0,
                           "CHECK failed: !IsMapEntryMessage(field->message_type()): ");
        internal::LogFinisher::operator=((LogFinisher *)local_160,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_1c0);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"TableStruct","");
      pDVar16 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
      UniqueName(&local_50,&local_f0,(string *)**(undefined8 **)(pDVar16 + 0x10),local_1f0);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x419f58);
      local_180 = &local_170;
      plVar22 = plVar17 + 2;
      if ((long *)*plVar17 == plVar22) {
        local_170 = *plVar22;
        lStack_168 = plVar17[3];
      }
      else {
        local_170 = *plVar22;
        local_180 = (long *)*plVar17;
      }
      local_178 = plVar17[1];
      *plVar17 = (long)plVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_180);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      puVar23 = (ulong *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_218.field_2._M_allocated_capacity = *puVar23;
        local_218.field_2._8_8_ = plVar17[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *puVar23;
        local_218._M_dataplus._M_p = (pointer)*plVar17;
      }
      local_218._M_string_length = plVar17[1];
      *plVar17 = (long)puVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
      iVar12 = anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffffde0);
      local_160._0_8_ = (Formatter *)local_150;
      pcVar15 = FastInt32ToBufferLeft(iVar12,(char *)local_150);
      local_160._8_8_ = (long)pcVar15 - (long)local_150;
      local_1e0 = local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,local_160._0_8_,(char *)(local_160._0_8_ + local_160._8_8_));
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar26 = local_218.field_2._M_allocated_capacity;
      }
      uVar18 = (long)(_Rb_tree_color *)local_218._M_string_length + local_1d8;
      if ((ulong)uVar26 < uVar18) {
        uVar28 = 0xf;
        if (local_1e0 != local_1d0) {
          uVar28 = local_1d0[0];
        }
        if (uVar28 < uVar18) goto LAB_002a685b;
        plVar17 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_1e0,0,(char *)0x0,
                                     (ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002a685b:
        plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1e0);
      }
      local_238._M_p = local_228;
      pFVar5 = (Formatter *)(plVar17 + 2);
      if ((Formatter *)*plVar17 == pFVar5) {
        local_228 = (char  [8])pFVar5->printer_;
        in_stack_fffffffffffffde0 = plVar17[3];
      }
      else {
        local_228 = (char  [8])pFVar5->printer_;
        local_238._M_p = (pointer)*plVar17;
      }
      local_230 = plVar17[1];
      *plVar17 = (long)pFVar5;
      plVar17[1] = 0;
      *(undefined1 *)&pFVar5->printer_ = 0;
      local_128._0_8_ = local_128 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ptr","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_d0,(key_type *)local_128);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_238);
      if ((_Base_ptr)local_128._0_8_ != (_Base_ptr)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_);
      }
      if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
        operator_delete(local_238._M_p);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    local_160._0_8_ = &local_a0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_160 + 8),&local_a0.vars_._M_t);
    Formatter::AddMap(&local_a0,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_d0);
    Formatter::operator()<>
              (&local_a0,
               "{PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, $field_name$_), $tag$,PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, _has_bits_) * 8 + $hasbit$, $type$, $ptr$},\n"
              );
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_160._0_8_ + 8),
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_160 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_160 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_d0);
    lVar24 = local_188 + 1;
  } while (lVar24 == 1);
  iVar12 = 2;
  goto LAB_002a7561;
LAB_002a74c1:
  FVar13 = GetOptimizeFor(*(FileDescriptor **)(local_1e8->descriptor_ + 0x10),local_1f0,(bool *)0x0)
  ;
  pcVar15 = "UnknownFieldSetSerializer";
  if (FVar13 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    pcVar15 = "UnknownFieldSerializerLite";
  }
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,pcVar15,
             pcVar15 + (ulong)(FVar13 == FileOptions_OptimizeMode_LITE_RUNTIME) + 0x19);
  Formatter::operator()
            (&local_a0,
             "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::$1$)},\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
  if ((ExtensionRange *)local_1c0._0_8_ != (ExtensionRange *)(local_1c0 + 0x10)) {
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((_Base_ptr)local_128._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_128._0_8_);
  }
  iVar12 = (int)uVar28 + (int)lVar29 + 2;
LAB_002a7561:
  if (local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002a7573:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a0.vars_._M_t);
  return iVar12;
}

Assistant:

int MessageGenerator::GenerateFieldMetadata(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!options_.table_driven_serialization) {
    return 0;
  }

  std::vector<const FieldDescriptor*> sorted = SortFieldsByNumber(descriptor_);
  if (IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < 2; i++) {
      const FieldDescriptor* field = sorted[i];
      const FieldGenerator& generator = field_generators_.get(field);

      uint32_t tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormat::WireTypeForFieldType(field->type()));

      std::map<std::string, std::string> vars;
      vars["classtype"] = QualifiedClassName(descriptor_, options_);
      vars["field_name"] = FieldName(field);
      vars["tag"] = StrCat(tag);
      vars["hasbit"] = StrCat(i);
      vars["type"] = StrCat(CalcFieldNum(generator, field, options_));
      vars["ptr"] = "nullptr";
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_CHECK(!IsMapEntryMessage(field->message_type()));
        vars["ptr"] =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
      Formatter::SaveState saver(&format);
      format.AddMap(vars);
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, $field_name$_), $tag$,"
          "PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, _has_bits_) * 8 + $hasbit$, $type$, "
          "$ptr$},\n");
    }
    return 2;
  }
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_),"
      " 0, 0, 0, nullptr},\n");
  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  sorted_extensions.reserve(descriptor_->extension_range_count());
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  for (int i = 0, extension_idx = 0; /* no range */; i++) {
    for (; extension_idx < sorted_extensions.size() &&
           (i == sorted.size() ||
            sorted_extensions[extension_idx]->start < sorted[i]->number());
         extension_idx++) {
      const Descriptor::ExtensionRange* range =
          sorted_extensions[extension_idx];
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), "
          "$1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::ExtensionSerializer)},\n",
          range->start, range->end);
    }
    if (i == sorted.size()) break;
    const FieldDescriptor* field = sorted[i];

    uint32_t tag = internal::WireFormatLite::MakeTag(
        field->number(), WireFormat::WireTypeForFieldType(field->type()));
    if (field->is_packed()) {
      tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    }

    std::string classfieldname = FieldName(field);
    if (field->real_containing_oneof()) {
      classfieldname = field->containing_oneof()->name();
    }
    format.Set("field_name", classfieldname);
    std::string ptr = "nullptr";
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsMapEntryMessage(field->message_type())) {
        format(
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, "
            "::$proto_ns$::internal::FieldMetadata::kSpecial, "
            "reinterpret_cast<const void*>(static_cast< "
            "::$proto_ns$::internal::SpecialSerializer>("
            "::$proto_ns$::internal::MapFieldSerializer< "
            "::$proto_ns$::internal::MapEntryToMapField<"
            "$3$>::MapFieldType, "
            "$tablename$::serialization_table>))},\n",
            tag, FindMessageIndexInFile(field->message_type()),
            QualifiedClassName(field->message_type(), options_));
        continue;
      } else if (!field->message_type()->options().message_set_wire_format()) {
        // message_set doesn't have the usual table and we need to
        // dispatch to generated serializer, hence ptr stays zero.
        ptr =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
    }

    const FieldGenerator& generator = field_generators_.get(field);
    int type = CalcFieldNum(generator, field, options_);

    if (IsLazy(field, options_, scc_analyzer_)) {
      type = internal::FieldMetadata::kSpecial;
      ptr = "reinterpret_cast<const void*>(::" + variables_["proto_ns"] +
            "::internal::LazyFieldSerializer";
      if (field->real_containing_oneof()) {
        ptr += "OneOf";
      } else if (!HasHasbit(field)) {
        ptr += "NoPresence";
      }
      ptr += ")";
    }

    if (field->options().weak()) {
      // TODO(gerbens) merge weak fields into ranges
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "$classtype$, _weak_field_map_), $1$, $1$, "
          "::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n",
          tag);
    } else if (field->real_containing_oneof()) {
      format.Set("oneofoffset",
                 sizeof(uint32_t) * field->containing_oneof()->index());
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$,"
          " PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + "
          "$oneofoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else if (HasHasbit(field)) {
      format.Set("hasbitsoffset", has_bit_indices_[field->index()]);
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + "
          "$hasbitsoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else {
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, ~0u, $2$, $3$},\n",
          tag, type, ptr);
    }
  }
  int num_field_metadata = 1 + sorted.size() + sorted_extensions.size();
  num_field_metadata++;
  std::string serializer = UseUnknownFieldSet(descriptor_->file(), options_)
                               ? "UnknownFieldSetSerializer"
                               : "UnknownFieldSerializerLite";
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, "
      "::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const "
      "void*>(::$proto_ns$::internal::$1$)},\n",
      serializer);
  return num_field_metadata;
}